

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O0

void __thiscall cashew::JSPrinter::printAssign(JSPrinter *this,Ref node)

{
  Value *this_00;
  Assign *this_01;
  Ref *pRVar1;
  Assign *assign;
  JSPrinter *this_local;
  Ref node_local;
  
  this_local = (JSPrinter *)node.inst;
  this_00 = Ref::operator->((Ref *)&this_local);
  this_01 = cashew::Value::asAssign(this_00);
  pRVar1 = Assign::target(this_01);
  printChild(this,pRVar1->inst,(Ref)this_local,-1);
  space(this);
  emit(this,'=');
  space(this);
  pRVar1 = Assign::value(this_01);
  printChild(this,pRVar1->inst,(Ref)this_local,1);
  return;
}

Assistant:

void printAssign(Ref node) {
    auto* assign = node->asAssign();
    printChild(assign->target(), node, -1);
    space();
    emit('=');
    space();
    printChild(assign->value(), node, 1);
  }